

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# prim-types.hh
# Opt level: O2

optional<float> * __thiscall
tinyusdz::XformOp::get_value<float>
          (optional<float> *__return_storage_ptr__,XformOp *this,double t,
          TimeSampleInterpolationType interp)

{
  bool bVar1;
  storage_t<float> sVar2;
  PrimVar *this_00;
  float value;
  storage_t<float> local_34;
  double local_30;
  optional<float> local_28;
  
  this_00 = &this->_var;
  local_30 = t;
  bVar1 = primvar::PrimVar::is_timesamples(this_00);
  if (bVar1) {
    bVar1 = primvar::PrimVar::get_interpolated_value<float>
                      (this_00,local_30,interp,(float *)&local_34);
    sVar2 = (storage_t<float>)0x0;
    if (bVar1) {
      sVar2 = local_34;
    }
    __return_storage_ptr__->has_value_ = bVar1;
    __return_storage_ptr__->contained = sVar2;
  }
  else {
    primvar::PrimVar::get_value<float>(&local_28,this_00);
    __return_storage_ptr__->has_value_ = local_28.has_value_;
    if (local_28.has_value_ == true) {
      __return_storage_ptr__->contained = local_28.contained;
    }
  }
  return __return_storage_ptr__;
}

Assistant:

nonstd::optional<T> get_value(double t = value::TimeCode::Default(), 
          value::TimeSampleInterpolationType interp =
               value::TimeSampleInterpolationType::Linear) const {
    if (is_timesamples()) {
      T value;
      if (get_interpolated_value(&value, t, interp)) {
        return value;
      }
      return nonstd::nullopt;
    }

    return _var.get_value<T>();
  }